

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

char * tinyfd_selectFolderDialog(char *aTitle,char *aDefaultPath)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  FILE *__stream;
  char *pcVar6;
  size_t __n;
  char *pcVar7;
  undefined4 uVar8;
  char lDialogString [1024];
  undefined1 local_428 [6];
  undefined1 uStack_422;
  undefined8 uStack_421;
  undefined8 uStack_419;
  char acStack_410 [5];
  char acStack_40b [8];
  char acStack_403 [13];
  char acStack_3f6 [974];
  
  tinyfd_selectFolderDialog::lBuff[0] = '\0';
  iVar3 = osascriptPresent();
  if (iVar3 == 0) {
    iVar3 = kdialogPresent();
    if (iVar3 == 0) {
      iVar3 = zenityPresent();
      if ((iVar3 == 0) && (iVar3 = matedialogPresent(), iVar3 == 0)) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        iVar3 = qarmaPresent();
        if (iVar3 == 0) {
          iVar3 = xdialogPresent();
          if ((iVar3 == 0) && (iVar3 = tkinter2Present(), iVar3 != 0)) {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              uVar8._0_1_ = 'o';
              uVar8._1_1_ = 'n';
              uVar8._2_1_ = '2';
              uVar8._3_1_ = '-';
LAB_00118c37:
              tinyfd_response._4_2_ = (undefined2)uVar8;
              tinyfd_response[6] = SUB41(uVar8,2);
              builtin_strncpy(tinyfd_response + 8,"tkinter",8);
              tinyfd_response[7] = SUB41(uVar8,3);
              builtin_strncpy(tinyfd_response,"pyth",4);
              return (char *)0x1;
            }
            strcpy(local_428,gPython2Name);
            iVar3 = isTerminalRunning();
            if ((iVar3 == 0) && (iVar3 = isDarwin(), iVar3 != 0)) {
              sVar5 = strlen(local_428);
              *(undefined4 *)(local_428 + sVar5) = 0x692d20;
            }
            sVar5 = strlen(local_428);
            memcpy(local_428 + sVar5,
                   " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();",0x47);
            iVar3 = isDarwin();
            if (iVar3 != 0) {
              sVar5 = strlen(local_428);
              memcpy(local_428 + sVar5,
                     "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                     ,0x78);
            }
            sVar5 = strlen(local_428);
            builtin_strncpy(local_428 + sVar5,"print tk",8);
            builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"FileDial",8);
            builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 1),"og.askdi",8);
            builtin_strncpy(acStack_410 + sVar5,"rectory(",8);
            acStack_40b[sVar5 + 3] = '\0';
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              sVar5 = strlen(local_428);
              *(undefined8 *)(local_428 + sVar5) = 0x273d656c746974;
              strcat(local_428,aTitle);
              sVar5 = strlen(local_428);
              *(undefined2 *)(local_428 + sVar5) = 0x2c27;
              local_428[sVar5 + 2] = 0;
            }
            if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
              sVar5 = strlen(local_428);
              *(undefined8 *)(local_428 + sVar5) = 0x646c616974696e69;
              *(undefined8 *)(local_428 + sVar5 + 5) = 0x273d7269646c61;
              strcat(local_428,aDefaultPath);
              sVar5 = strlen(local_428);
              *(undefined2 *)(local_428 + sVar5) = 0x27;
            }
            sVar5 = strlen(local_428);
            *(undefined2 *)(local_428 + sVar5) = 0x2229;
            local_428[sVar5 + 2] = 0;
          }
          else {
            iVar3 = xdialogPresent();
            if ((iVar3 == 0) && (iVar3 = tkinter3Present(), iVar3 != 0)) {
              if (aTitle == (char *)0x0) {
                strcpy(local_428,gPython3Name);
                sVar5 = strlen(local_428);
                memcpy(local_428 + sVar5,
                       " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                       ,0x59);
                sVar5 = strlen(local_428);
                builtin_strncpy(local_428 + sVar5,"print( f",8);
                builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"iledialo",8);
                builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 1),"g.askdir",8);
                builtin_strncpy(acStack_410 + sVar5,"ectory(",8);
              }
              else {
                iVar3 = strcmp(aTitle,"tinyfd_query");
                if (iVar3 == 0) {
                  uVar8._0_1_ = 'o';
                  uVar8._1_1_ = 'n';
                  uVar8._2_1_ = '3';
                  uVar8._3_1_ = '-';
                  goto LAB_00118c37;
                }
                strcpy(local_428,gPython3Name);
                sVar5 = strlen(local_428);
                memcpy(local_428 + sVar5,
                       " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                       ,0x59);
                sVar5 = strlen(local_428);
                builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 1),"g.askdir",8);
                builtin_strncpy(acStack_410 + sVar5,"ectory(",8);
                builtin_strncpy(local_428 + sVar5,"print( f",8);
                builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"iledialo",8);
                if (*aTitle != '\0') {
                  sVar5 = strlen(local_428);
                  *(undefined8 *)(local_428 + sVar5) = 0x273d656c746974;
                  strcat(local_428,aTitle);
                  sVar5 = strlen(local_428);
                  *(undefined2 *)(local_428 + sVar5) = 0x2c27;
                  local_428[sVar5 + 2] = 0;
                }
              }
              if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
                sVar5 = strlen(local_428);
                *(undefined8 *)(local_428 + sVar5) = 0x646c616974696e69;
                *(undefined8 *)(local_428 + sVar5 + 5) = 0x273d7269646c61;
                strcat(local_428,aDefaultPath);
                sVar5 = strlen(local_428);
                *(undefined2 *)(local_428 + sVar5) = 0x27;
              }
              sVar5 = strlen(local_428);
              *(undefined4 *)(local_428 + sVar5) = 0x22292029;
              local_428[sVar5 + 4] = 0;
            }
            else {
              iVar3 = xdialogPresent();
              if ((iVar3 == 0) && (pcVar7 = dialogName(), pcVar7 == (char *)0x0)) {
                if (aTitle == (char *)0x0) {
                  aTitle = (char *)0x0;
                }
                else {
                  iVar3 = strcmp(aTitle,"tinyfd_query");
                  if (iVar3 == 0) {
                    pcVar7 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                    return pcVar7;
                  }
                }
                pcVar7 = tinyfd_inputBox(aTitle,"Select folder","");
                if (pcVar7 == (char *)0x0) {
                  return (char *)0x0;
                }
                cVar2 = *pcVar7;
                goto joined_r0x00118c63;
              }
              iVar3 = xdialogPresent();
              if (iVar3 == 0) {
                iVar4 = isTerminalRunning();
                if (iVar4 != 0) {
                  if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)
                     ) {
                    builtin_strncpy(tinyfd_response,"dialog",7);
                    return (char *)0x0;
                  }
                  local_428._0_4_ = 0x61696428;
                  local_428._4_2_ = 0x6f6c;
                  uStack_422 = 0x67;
                  uStack_421._0_1_ = 0x20;
                  uStack_421._1_1_ = 0;
                  goto LAB_001188ce;
                }
                if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0))
                {
                  builtin_strncpy(tinyfd_response,"dialog",7);
                  return (char *)0x0;
                }
                pcVar7 = terminalName();
                strcpy(local_428,pcVar7);
                sVar5 = strlen(local_428);
                *(undefined2 *)(local_428 + sVar5) = 0x2827;
                local_428[sVar5 + 2] = 0;
                pcVar7 = dialogName();
                strcat(local_428,pcVar7);
                sVar5 = strlen(local_428);
                *(undefined2 *)(local_428 + sVar5) = 0x20;
                bVar1 = false;
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0))
                {
                  tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
                  builtin_strncpy(tinyfd_response,"xdialog",7);
                  return (char *)0x1;
                }
                local_428._0_4_ = 0x69645828;
                local_428._4_2_ = 0x6c61;
                uStack_422 = 0x6f;
                uStack_421._0_1_ = 0x67;
                uStack_421._1_1_ = 0x20;
                uStack_421._2_1_ = 0;
LAB_001188ce:
                bVar1 = true;
              }
              if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
                sVar5 = strlen(local_428);
                *(undefined8 *)(local_428 + sVar5) = 0x20656c7469742d2d;
                *(undefined2 *)((long)&uStack_421 + sVar5 + 1) = 0x22;
                strcat(local_428,aTitle);
                sVar5 = strlen(local_428);
                *(undefined2 *)(local_428 + sVar5) = 0x2022;
                local_428[sVar5 + 2] = 0;
              }
              iVar4 = xdialogPresent();
              if ((iVar4 == 0) && (iVar4 = gdialogPresent(), iVar4 == 0)) {
                sVar5 = strlen(local_428);
                *(undefined8 *)(local_428 + sVar5) = 0x69746b6361622d2d;
                *(undefined8 *)(&uStack_422 + sVar5) = 0x2220656c746974;
                sVar5 = strlen(local_428);
                memcpy(local_428 + sVar5,
                       "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY",
                       0x4b);
                sVar5 = strlen(local_428);
                *(undefined2 *)(local_428 + sVar5) = 0x2022;
                local_428[sVar5 + 2] = 0;
              }
              sVar5 = strlen(local_428);
              *(undefined8 *)(local_428 + sVar5) = 0x63656c6573642d2d;
              *(undefined4 *)((long)&uStack_421 + sVar5 + 1) = 0x222074;
              if ((aDefaultPath == (char *)0x0) || (*aDefaultPath == '\0')) {
                iVar4 = isTerminalRunning();
                if (iVar4 == 0 && iVar3 == 0) {
                  pcVar7 = getenv("HOME");
                  strcat(local_428,pcVar7);
                  sVar5 = strlen(local_428);
                  *(undefined2 *)(local_428 + sVar5) = 0x2f;
                }
                else {
                  sVar5 = strlen(local_428);
                  *(undefined2 *)(local_428 + sVar5) = 0x2f2e;
                  local_428[sVar5 + 2] = 0;
                }
              }
              else {
                strcat(local_428,aDefaultPath);
                ensureFinalSlash(local_428);
              }
              sVar5 = strlen(local_428);
              if (iVar3 == 0) {
                builtin_strncpy(local_428 + sVar5,"\" 0 60  ",8);
                builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),">/dev/tt",8);
                *(undefined4 *)((long)&uStack_419 + sVar5 + 1) = 0x202979;
                sVar5 = strlen(local_428);
                if (bVar1) {
                  builtin_strncpy(local_428 + sVar5,"2>&1 ; c",8);
                  builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"lear >/d",8);
                  *(undefined8 *)((long)&uStack_419 + sVar5) = 0x7974742f766564;
                }
                else {
                  builtin_strncpy(acStack_403 + sVar5 + 3,"m /tmp/tin",10);
                  builtin_strncpy(acStack_3f6 + sVar5,"yfd.txt",8);
                  builtin_strncpy(acStack_40b + sVar5 + 3,"fd.txt;r",8);
                  builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 1),"t\';cat /",8);
                  builtin_strncpy(acStack_410 + sVar5,"tmp/tiny",8);
                  builtin_strncpy(local_428 + sVar5,"2>/tmp/t",8);
                  builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"inyfd.tx",8);
                }
              }
              else {
                *(undefined8 *)((long)&uStack_421 + sVar5) = 0x2031263e322029;
                builtin_strncpy(local_428 + sVar5,"\" 0 60 )",8);
              }
            }
          }
          goto LAB_0011852b;
        }
      }
      iVar3 = zenityPresent();
      if (iVar3 == 0) {
        iVar3 = matedialogPresent();
        if (iVar3 == 0) {
          if (shellementaryPresent_lShellementaryPresent == '\0') {
            shellementaryPresent_lShellementaryPresent = '\x01';
          }
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            builtin_strncpy(tinyfd_response,"qarma",6);
            return (char *)0x1;
          }
          local_428._4_2_ = 0x61;
          local_428._0_4_ = 0x6d726171;
          pcVar7 = getenv("SSH_TTY");
          if (pcVar7 == (char *)0x0) {
            sVar5 = strlen(local_428);
            pcVar7 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
            __n = 0x41;
            goto LAB_00118449;
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            builtin_strncpy(tinyfd_response,"matedialog",0xb);
            return (char *)0x1;
          }
          local_428._0_4_ = 0x6574616d;
          local_428._4_2_ = 0x6964;
          uStack_422 = 0x61;
          uStack_421._0_1_ = 0x6c;
          uStack_421._1_1_ = 0x6f;
          uStack_421._2_1_ = 0x67;
          uStack_421._3_1_ = 0;
        }
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"zenity",7);
          return (char *)0x1;
        }
        local_428._4_2_ = 0x7974;
        uStack_422 = 0;
        local_428._0_4_ = 0x696e657a;
        iVar3 = zenity3Present();
        if ((3 < iVar3) && (pcVar7 = getenv("SSH_TTY"), pcVar7 == (char *)0x0)) {
          sVar5 = strlen(local_428);
          pcVar7 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
          __n = 0x4b;
LAB_00118449:
          memcpy(local_428 + sVar5,pcVar7,__n);
        }
      }
      sVar5 = strlen(local_428);
      builtin_strncpy(local_428 + sVar5," --file-",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"selectio",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 7),"ion --di",8);
      builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 7),"rectory",8);
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar5 = strlen(local_428);
        *(undefined8 *)(local_428 + sVar5) = 0x656c7469742d2d20;
        *(undefined4 *)((long)&uStack_421 + sVar5) = 0x223d65;
        strcat(local_428,aTitle);
        sVar5 = strlen(local_428);
        *(undefined2 *)(local_428 + sVar5) = 0x22;
      }
      if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
        sVar5 = strlen(local_428);
        *(undefined8 *)(local_428 + sVar5) = 0x6e656c69662d2d20;
        *(undefined8 *)(&uStack_422 + sVar5) = 0x223d656d616e65;
        strcat(local_428,aDefaultPath);
        sVar5 = strlen(local_428);
        *(undefined2 *)(local_428 + sVar5) = 0x22;
      }
      if (tinyfd_silent != 0) {
        sVar5 = strlen(local_428);
        *(undefined8 *)(local_428 + sVar5) = 0x2f7665642f3e3220;
        *(undefined8 *)(&uStack_422 + sVar5) = 0x206c6c756e2f76;
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
        tinyfd_response._7_4_ = tinyfd_response._7_4_ & 0xffffff00;
        builtin_strncpy(tinyfd_response,"kdialog",7);
        return (char *)0x1;
      }
      local_428._0_4_ = 0x6169646b;
      local_428._4_2_ = 0x6f6c;
      uStack_422 = 0x67;
      uStack_421._0_1_ = 0;
      iVar3 = kdialogPresent();
      if (iVar3 == 2) {
        sVar5 = strlen(local_428);
        memcpy(local_428 + sVar5,
               " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",0x41);
      }
      sVar5 = strlen(local_428);
      builtin_strncpy(local_428 + sVar5," --getex",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"istingdi",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 2),"stingdir",8);
      builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 2),"ectory ",8);
      if ((aDefaultPath == (char *)0x0) || (*aDefaultPath == '\0')) {
        sVar5 = strlen(local_428);
        *(undefined4 *)(local_428 + sVar5) = 0x44575024;
        *(undefined2 *)(local_428 + sVar5 + 4) = 0x2f;
      }
      else {
        if (*aDefaultPath != '/') {
          sVar5 = strlen(local_428);
          *(undefined4 *)(local_428 + sVar5) = 0x44575024;
          *(undefined2 *)(local_428 + sVar5 + 4) = 0x2f;
        }
        sVar5 = strlen(local_428);
        *(undefined2 *)(local_428 + sVar5) = 0x22;
        strcat(local_428,aDefaultPath);
        sVar5 = strlen(local_428);
        *(undefined2 *)(local_428 + sVar5) = 0x22;
      }
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar5 = strlen(local_428);
        *(undefined8 *)(local_428 + sVar5) = 0x656c7469742d2d20;
        *(undefined4 *)((long)&uStack_421 + sVar5) = 0x222065;
        strcat(local_428,aTitle);
        sVar5 = strlen(local_428);
        *(undefined2 *)(local_428 + sVar5) = 0x22;
      }
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return (char *)0x1;
    }
    local_428._0_4_ = 0x7361736f;
    local_428._4_2_ = 0x7263;
    uStack_422 = 0x69;
    uStack_421._0_1_ = 0x70;
    uStack_421._1_1_ = 0x74;
    uStack_421._2_1_ = 0x20;
    uStack_421._3_1_ = 0;
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      sVar5 = strlen(local_428);
      builtin_strncpy(acStack_403 + sVar5 + 3,"e \'Activate\'",0xd);
      builtin_strncpy(local_428 + sVar5," -e \'tel",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"l applic",8);
      builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 1),"ation \"S",8);
      builtin_strncpy(acStack_410 + sVar5,"ystem Ev",8);
      builtin_strncpy(acStack_40b + sVar5 + 3,"ents\"\' -",8);
    }
    sVar5 = strlen(local_428);
    builtin_strncpy(local_428 + sVar5," -e \'try",8);
    builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"\' -e \'PO",8);
    builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 1),"SIX path",8);
    builtin_strncpy(acStack_410 + sVar5," of ( ch",8);
    builtin_strncpy(acStack_40b + sVar5," choose ",8);
    builtin_strncpy(acStack_403 + sVar5,"folder ",8);
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar5 = strlen(local_428);
      *(undefined8 *)(local_428 + sVar5) = 0x6f72702068746977;
      *(undefined8 *)(&uStack_422 + sVar5) = 0x222074706d6f72;
      strcat(local_428,aTitle);
      sVar5 = strlen(local_428);
      *(undefined2 *)(local_428 + sVar5) = 0x2022;
      local_428[sVar5 + 2] = 0;
    }
    if ((aDefaultPath != (char *)0x0) && (*aDefaultPath != '\0')) {
      sVar5 = strlen(local_428);
      builtin_strncpy(local_428 + sVar5,"default ",8);
      builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"location",8);
      *(undefined4 *)((long)&uStack_419 + sVar5) = 0x22206e;
      strcat(local_428,aDefaultPath);
      sVar5 = strlen(local_428);
      *(undefined2 *)(local_428 + sVar5) = 0x2022;
      local_428[sVar5 + 2] = 0;
    }
    sVar5 = strlen(local_428);
    *(undefined4 *)(local_428 + sVar5) = 0x202729;
    sVar5 = strlen(local_428);
    builtin_strncpy(local_428 + sVar5,"-e \'on e",8);
    builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 1),"rror num",8);
    builtin_strncpy((char *)((long)&uStack_421 + sVar5 + 4),"r number",8);
    builtin_strncpy((char *)((long)&uStack_419 + sVar5 + 4)," -128\' ",8);
    sVar5 = strlen(local_428);
    *(undefined8 *)(local_428 + sVar5) = 0x20646e652720652d;
    *(undefined8 *)(local_428 + sVar5 + 5) = 0x2779727420646e;
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      sVar5 = strlen(local_428);
      *(undefined8 *)(local_428 + sVar5) = 0x646e652720652d20;
      *(undefined8 *)((long)&uStack_421 + sVar5) = 0x276c6c65742064;
    }
  }
LAB_0011852b:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",local_428);
  }
  __stream = popen(local_428,"r");
  if (__stream == (FILE *)0x0) {
    return (char *)0x0;
  }
  pcVar7 = tinyfd_selectFolderDialog::lBuff;
  do {
    pcVar6 = fgets(tinyfd_selectFolderDialog::lBuff,0x400,__stream);
  } while (pcVar6 != (char *)0x0);
  pclose(__stream);
  sVar5 = strlen(tinyfd_selectFolderDialog::lBuff);
  cVar2 = tinyfd_selectFolderDialog::lBuff[0];
  if (tinyfd_openFileDialog::lBuff[sVar5 + 0x7fff] == '\n') {
    tinyfd_openFileDialog::lBuff[sVar5 + 0x7fff] = '\0';
    cVar2 = tinyfd_selectFolderDialog::lBuff[0];
  }
joined_r0x00118c63:
  if (cVar2 == '\0') {
    tinyfd_response[0xc] = (char)tinyfd_response._12_4_;
    tinyfd_response[0xd] = SUB41(tinyfd_response._12_4_,1);
    tinyfd_response[0xe] = SUB41(tinyfd_response._12_4_,2);
    tinyfd_response[0xf] = SUB41(tinyfd_response._12_4_,3);
    tinyfd_response[7] = (char)tinyfd_response._7_4_;
    tinyfd_response[8] = SUB41(tinyfd_response._7_4_,1);
    tinyfd_response[9] = SUB41(tinyfd_response._7_4_,2);
    tinyfd_response[10] = SUB41(tinyfd_response._7_4_,3);
    tinyfd_response[4] = (char)tinyfd_response._4_2_;
    tinyfd_response[5] = SUB21(tinyfd_response._4_2_,1);
    tinyfd_response[0] = (char)tinyfd_response._0_4_;
    tinyfd_response[1] = SUB41(tinyfd_response._0_4_,1);
    tinyfd_response[2] = SUB41(tinyfd_response._0_4_,2);
    tinyfd_response[3] = SUB41(tinyfd_response._0_4_,3);
    return (char *)0x0;
  }
  iVar3 = dirExists(pcVar7);
  if (iVar3 == 0) {
    return (char *)0x0;
  }
  return pcVar7;
}

Assistant:

char const * tinyfd_selectFolderDialog(
        char const * const aTitle , /* NULL or "" */
        char const * const aDefaultPath ) /* NULL or "" */
{
    static char lBuff [MAX_PATH_OR_CMD] ;
        char const * p ;
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
#ifndef TINYFD_NOSELECTFOLDERWIN
                        p = selectFolderDialogWinGui8(lBuff, aTitle, aDefaultPath);
                }
                else
                {
                        p = selectFolderDialogWinGuiA(lBuff, aTitle, aDefaultPath);
#endif /*TINYFD_NOSELECTFOLDERWIN*/
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = selectFolderDialogWinConsole(lBuff,aTitle,aDefaultPath);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Select folder","");
        }
        
        if ( ! p || ! strlen( p ) || ! dirExists( p ) )
        {
                return NULL ;
        }
        return p ;
}